

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall Potassco::Application::printHelp(Application *this,OptionContext *root)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t sVar3;
  FileOut out;
  OptionOutput local_78;
  void *local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  FILE *local_58;
  string local_48;
  
  iVar1 = (**this->_vptr_Application)();
  iVar2 = (*this->_vptr_Application[1])(this);
  printf("%s version %s\n",CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
  (*this->_vptr_Application[0xb])(this);
  local_78._vptr_OptionOutput = (_func_int **)&PTR__OptionOutputImpl_0012c150;
  local_70 = (void *)0x0;
  uStack_68 = 0;
  local_60 = 0;
  local_58 = _stdout;
  ProgramOptions::OptionContext::description(root,&local_78);
  putchar(10);
  (*this->_vptr_Application[0xb])(this);
  iVar1 = (**this->_vptr_Application)(this);
  iVar2 = (**this->_vptr_Application)(this);
  sVar3 = strlen((char *)CONCAT44(extraout_var_02,iVar2));
  ProgramOptions::OptionContext::defaults_abi_cxx11_(&local_48,root,sVar3 + 1);
  printf("Default command-line:\n%s %s\n",CONCAT44(extraout_var_01,iVar1),local_48._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  fflush(_stdout);
  local_78._vptr_OptionOutput = (_func_int **)&PTR__OptionOutputImpl_0012c150;
  if (local_70 != (void *)0x0) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void Application::printHelp(const OptionContext& root) {
	printf("%s version %s\n", getName(), getVersion());
	printUsage();
	ProgramOptions::FileOut out(stdout);
	root.description(out);
	printf("\n");
	printUsage();
	printf("Default command-line:\n%s %s\n", getName(), root.defaults(strlen(getName())+1).c_str());
	fflush(stdout);
}